

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minTemp0_fast(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  int blockSize_00;
  int iVar1;
  ulong x;
  word temp;
  int blockSize;
  int i;
  int *pDifStart_local;
  int nWords_local;
  int iVar_local;
  word *pInOut_local;
  
  blockSize_00 = 1 << ((byte)iVar & 0x1f);
  temp._4_4_ = nWords + -1;
  while( true ) {
    if (temp._4_4_ < 0) {
      *pDifStart = 0;
      return 0;
    }
    if (0x3f < blockSize_00 * 3) break;
    x = pInOut[temp._4_4_] & SFmask[iVar][0] ^
        (pInOut[temp._4_4_] & SFmask[iVar][3]) << ((char)blockSize_00 * '\x03' & 0x3fU);
    if (x != 0) {
      iVar1 = firstShiftWithOneBit(x,blockSize_00);
      *pDifStart = (temp._4_4_ * 100 + 0x14) - iVar1;
      if ((pInOut[temp._4_4_] & SFmask[iVar][0]) <
          (pInOut[temp._4_4_] & SFmask[iVar][3]) << ((char)blockSize_00 * '\x03' & 0x3fU)) {
        return 0;
      }
      return 3;
    }
    temp._4_4_ = temp._4_4_ + -1;
  }
  __assert_fail("3*blockSize < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                ,0x89,"int minTemp0_fast(word *, int, int, int *)");
}

Assistant:

int minTemp0_fast(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=nWords - 1; i>=0; i--)
    {
        assert( 3*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][0])) ^ ((pInOut[i] & SFmask[iVar][3])<<(3*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][0])) < ((pInOut[i] & SFmask[iVar][3])<<(3*blockSize)) )
                return 0;
            else
                return 3;
        }
    }
    *pDifStart=0;
    return 0;

}